

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

void sd_offset_update<sparse_parameters>
               (sparse_parameters *weights,features *fs,uint64_t offset,float update,
               float regularization)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  float *pfVar4;
  weight *pwVar5;
  long in_RDX;
  v_array<float> *in_RSI;
  size_t in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  sparse_parameters *unaff_retaddr;
  size_t i;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    sVar3 = features::size((features *)0x23b2bc);
    if (sVar3 <= local_28) break;
    pfVar4 = v_array<float>::operator[](in_RSI,local_28);
    fVar1 = *pfVar4;
    v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RSI + 1),local_28);
    pwVar5 = sparse_parameters::operator[](unaff_retaddr,in_RDI);
    fVar2 = pwVar5[in_RDX];
    v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RSI + 1),local_28);
    pwVar5 = sparse_parameters::operator[](unaff_retaddr,in_RDI);
    pwVar5[in_RDX] = in_XMM0_Da * fVar1 + -(in_XMM1_Da * fVar2) + pwVar5[in_RDX];
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void sd_offset_update(T& weights, features& fs, uint64_t offset, float update, float regularization)
{
  for (size_t i = 0; i < fs.size(); i++)
    (&weights[fs.indicies[i]])[offset] += update * fs.values[i] - regularization * (&weights[fs.indicies[i]])[offset];
}